

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

int nonce_function_failing
              (uchar *nonce32,uchar *msg,size_t msglen,uchar *key32,uchar *xonly_pk32,uchar *algo,
              size_t algolen,void *data)

{
  uchar *algo_local;
  uchar *xonly_pk32_local;
  uchar *key32_local;
  size_t msglen_local;
  uchar *msg_local;
  uchar *nonce32_local;
  
  return 0;
}

Assistant:

static int nonce_function_failing(unsigned char *nonce32, const unsigned char *msg, size_t msglen, const unsigned char *key32, const unsigned char *xonly_pk32, const unsigned char *algo, size_t algolen, void *data) {
    (void) msg;
    (void) msglen;
    (void) key32;
    (void) xonly_pk32;
    (void) algo;
    (void) algolen;
    (void) data;
    (void) nonce32;
    return 0;
}